

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int iVar3;
  typed_flags<f1,_f2,_f3,_f4,_f5,_f6,_f7,_f8,_f9> flags_9;
  typed_flags<eats_meat,_eats_grass,_has_tail> a3;
  typed_flags<eats_meat,_eats_grass,_has_tail> a2;
  typed_flags<eats_meat,_eats_grass,_has_tail> a1;
  byte local_49;
  array<unsigned_char,_1UL> local_48 [4];
  typed_flags<eats_meat,eats_grass,has_tail> local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_49 = 0;
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_40,&local_49,'0','1');
  iVar3 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar3 != 0) {
    __assert_fail("wolf.to_string() == \"000\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x2d,"int main()");
  }
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p),
                    local_40.field_2._M_allocated_capacity + 1);
  }
  local_49 = local_49 | 1;
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_40,&local_49,'0','1');
  iVar3 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar3 != 0) {
    __assert_fail("wolf.to_string() == \"001\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x30,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p),
                    local_40.field_2._M_allocated_capacity + 1);
  }
  local_49 = local_49 | 2;
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_40,&local_49,'-','1');
  iVar3 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar3 != 0) {
    __assert_fail("wolf.to_string(\'-\') == \"-11\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x33,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p),
                    local_40.field_2._M_allocated_capacity + 1);
  }
  bVar2 = local_49 & 0xf9;
  local_49 = bVar2 + 4;
  if (bVar2 != 1) {
    __assert_fail("wolf.to_integral<int>() == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x38,"int main()");
  }
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_40,&local_49,'-','+');
  iVar3 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar3 != 0) {
    __assert_fail("wolf.to_string(\'-\', \'+\') == \"+-+\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x39,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p),
                    local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_49 == 0) {
    __assert_fail("unknown != wolf",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0x55,"int main()");
  }
  tfl::detail::flags_storage<3UL>::flags_storage<char>
            ((flags_storage<3UL> *)&local_40,"111",3,'0','1');
  tfl::detail::flags_storage<3UL>::flags_storage<char>
            ((flags_storage<3UL> *)local_48,"010",3,'0','1');
  local_41 = (byte)local_48[0]._M_elems[0] & (byte)local_40._M_dataplus._M_p;
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_40,&local_41,'0','1');
  iVar3 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar3 != 0) {
    __assert_fail("a1.to_string() == \"010\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0xa3,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p),
                    local_40.field_2._M_allocated_capacity + 1);
  }
  tfl::detail::flags_storage<3UL>::flags_storage<char>
            ((flags_storage<3UL> *)&local_40,"11100",5,'0','1');
  tfl::detail::flags_storage<3UL>::flags_storage<char>
            ((flags_storage<3UL> *)local_48,"11001",5,'0','1');
  local_42 = (byte)local_48[0]._M_elems[0] | (byte)local_40._M_dataplus._M_p;
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_40,&local_42,'0','1');
  iVar3 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar3 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p),
                      local_40.field_2._M_allocated_capacity + 1);
    }
    tfl::detail::flags_storage<3UL>::flags_storage<char>
              ((flags_storage<3UL> *)&local_40,"10",2,'0','1');
    tfl::detail::flags_storage<3UL>::flags_storage<char>
              ((flags_storage<3UL> *)local_48,"11",2,'0','1');
    local_43 = (byte)local_48[0]._M_elems[0] ^ (byte)local_40._M_dataplus._M_p;
    tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
              (&local_40,&local_43,'0','1');
    iVar3 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar3 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_40._M_dataplus._M_p._1_7_,(byte)local_40._M_dataplus._M_p),
                        local_40.field_2._M_allocated_capacity + 1);
      }
      tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
                (&local_44,"X",0xffffffffffffffff,'0','1');
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                    ,0xab,"int main()");
    }
    __assert_fail("a3.to_string() == \"001\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                  ,0xa7,"int main()");
  }
  __assert_fail("a2.to_string() == \"101\"",
                "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/test/tester.cpp"
                ,0xa5,"int main()");
}

Assistant:

int main()
{    
    //typed_flags<eats_meat, eats_meat> ill_formed; // compilation error!
    
    typed_flags<> empty;
    assert( empty.size() == 0 );
    assert( sizeof(empty) == 1 );
    assert( empty.to_integral<int>() == 0 );
    assert( empty.none<>() );
    assert( !empty.any<>() );
    assert( empty.all<>() );
    empty = typed_flags<>(1);
    assert( empty.to_integral<int>() == 0 );
        
    assert( animal::index<eats_meat>() == 0 );
    assert( animal::index<eats_grass>() == 1 );
    assert( animal::index<has_tail>() == 2 );
    //animal::index<builds_spaceships>(); // compilation error!
    
    animal wolf;
    assert( wolf.size() == 3 );
    assert( sizeof(wolf) == 1 );
    assert( !wolf.test<eats_meat>() );
    assert( !wolf.test<eats_grass>() );
    assert( !wolf.test<has_tail>() );
    assert( wolf.to_string() == "000" );
    wolf.set<eats_meat>();
    assert( wolf.test<eats_meat>() );
    assert( wolf.to_string() == "001" );
    wolf.set<eats_grass>(true);
    assert( wolf.test<eats_grass>() );
    assert( wolf.to_string('-') == "-11" );
    wolf.set<eats_grass>(false);
    assert( !wolf.test<eats_grass>() );
    wolf.set<has_tail>();
    assert( wolf.test<has_tail>() );
    assert( wolf.to_integral<int>() == 5 );
    assert( wolf.to_string('-', '+') == "+-+" );
    
    animal rabbit;
    rabbit.set<eats_grass, has_tail>();
    assert( !rabbit.test<eats_meat>() );
    assert( rabbit.test<eats_grass>() );
    assert( rabbit.test<has_tail>() );
    assert( rabbit.to_integral<int>() == 6 );
    
    animal unknown;
    assert( unknown.to_integral<int>() == 0 );
    assert( unknown.none() );
    assert( !unknown.any() );
    assert( !unknown.all() );
    unknown.set();
    assert( unknown.to_integral<int>() == 7 );
    assert( !unknown.none() );
    assert( unknown.any() );
    assert( unknown.all() );
    animal tmp = unknown;
    tmp.reset<eats_meat, eats_grass, has_tail>();
    assert( tmp != unknown );
    unknown.reset();
    assert( tmp == unknown );
    assert( unknown.to_integral<int>() == 0 );
    assert( unknown.none() );
    assert( !unknown.any() );
    assert( !unknown.all() );
    assert( unknown != wolf );
    unknown = wolf;
    assert( unknown == wolf );
    assert( unknown.to_integral<int>() == wolf.to_integral<int>() );
    
    human engineer;
    assert( (engineer.none<eats_meat>()) );
    assert( (engineer.none<eats_meat, eats_grass>()) );
    assert( (engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.any<eats_meat>()) );
    assert( (!engineer.any<eats_meat, eats_grass>()) );
    assert( (!engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.all<eats_meat>()) );
    assert( (!engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.set<builds_spaceships>();
    assert( engineer.to_integral<int>() == 4 );
    assert( (engineer.none<eats_meat>()) );
    assert( (engineer.none<eats_meat, eats_grass>()) );
    assert( (!engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.any<eats_meat>()) );
    assert( (!engineer.any<eats_meat, eats_grass>()) );
    assert( (engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (!engineer.all<eats_meat>()) );
    assert( (!engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.flip<eats_meat, eats_grass, builds_spaceships>();
    assert( (!engineer.none<eats_meat>()) );
    assert( (!engineer.none<eats_meat, eats_grass>()) );
    assert( (!engineer.none<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (engineer.any<eats_meat>()) );
    assert( (engineer.any<eats_meat, eats_grass>()) );
    assert( (engineer.any<eats_meat, eats_grass, builds_spaceships>()) );
    assert( (engineer.all<eats_meat>()) );
    assert( (engineer.all<eats_meat, eats_grass>()) );
    assert( (!engineer.all<eats_meat, eats_grass, builds_spaceships>()) );
    engineer.flip();
    assert( !engineer.test<eats_meat>() );
    assert( !engineer.test<eats_grass>() );
    assert( engineer.test<builds_spaceships>() );
    assert( engineer.to_integral<int>() == 4 );
    
    //engineer = wolf; // compilation error!
    
    unknown = animal{65535};
    assert( unknown.to_integral<int>() == 7 );
    unknown = ~unknown;
    assert( unknown.to_integral<int>() == 0 );
    unknown |= animal{2};
    assert( unknown.to_integral<int>() == 2 );
    unknown ^= animal{7};
    assert( unknown.to_integral<int>() == 5 );
    unknown &= animal{4};
    assert( unknown.to_integral<int>() == 4 );
    
    constexpr flag<int> const_int_flag_0;
    constexpr flag<int> const_int_flag_1{1};
    flag<int> int_flag;
    assert( !int_flag && int_flag == const_int_flag_0 );
    int_flag = true;
    assert( int_flag && int_flag == const_int_flag_1 );
    int_flag = false;
    assert( !int_flag );
    
    unknown = animal{flag<has_tail>{1}, flag<eats_grass>{1}};
    assert( unknown == rabbit );
    unknown.set(flag<eats_meat>{1});
    assert( unknown != rabbit );
    unknown.set(flag<eats_meat>{0}, flag<eats_grass>{1});
    assert( unknown == rabbit );
    flag<eats_meat> f1;
    flag<eats_grass> f2;
    flag<has_tail> f3;
    unknown.get(f1, f2, f3);
    assert( f2 && f3 );
    assert( !f1 );
    
    auto a1 = animal{"111"} & animal{"010"};
    assert( a1.to_string() == "010" );
    auto a2 = animal{"11100"} | animal{"11001"};
    assert( a2.to_string() == "101" );
    auto a3 = animal{"10"} ^ animal{"11"};
    assert( a3.to_string() == "001" );
    try
    {
        animal{"X"};
        assert( false );
    }
    catch (std::invalid_argument const&)
    {
    }
    
    typed_flags<class f1, class f2, class f3, 
                class f4, class f5, class f6, 
                class f7, class f8>
                flags_8;
    assert( flags_8.size() == 8 );
    assert( sizeof(flags_8) == 1 );
    flags_8.set<class f8>();
    assert( flags_8.to_integral<int>() == 128 );
    assert( flags_8.to_string() == "10000000" );
    
    typed_flags<class f1, class f2, class f3, 
                class f4, class f5, class f6, 
                class f7, class f8, class f9>
                flags_9;
    assert( flags_9.size() == 9 );
    assert( sizeof(flags_9) == 2 );
    //flags_9.to_integral<uint8_t>(); // compilation error!
    flags_9.set<class f1, class f9>();
    assert( flags_9.to_integral<int>() == 257 );
    assert( flags_9.to_string() == "100000001" );
    
    return 0;
}